

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::InitialTimeZoneRule::operator==(InitialTimeZoneRule *this,TimeZoneRule *that)

{
  bool bVar1;
  UBool UVar2;
  
  if (&this->super_TimeZoneRule == that) {
    UVar2 = '\x01';
  }
  else {
    bVar1 = std::type_info::operator==
                      ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                       (type_info *)(that->super_UObject)._vptr_UObject[-1]);
    if (bVar1) {
      UVar2 = TimeZoneRule::operator==(&this->super_TimeZoneRule,that);
      return UVar2;
    }
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UBool
InitialTimeZoneRule::operator==(const TimeZoneRule& that) const {
    return ((this == &that) ||
            (typeid(*this) == typeid(that) &&
            TimeZoneRule::operator==(that)));
}